

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint h;
  long *p;
  BYTE *pBVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  char cVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  
  uVar12 = (ms->cParams).searchLog;
  if (5 < uVar12) {
    uVar12 = 6;
  }
  uVar10 = 4;
  if (4 < uVar12) {
    uVar10 = uVar12;
  }
  uVar12 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar12 < 6) {
    uVar14 = uVar12;
  }
  uVar18 = (ulong)ms->nextToUpdate;
  pBVar1 = (ms->window).base;
  uVar13 = (long)ip - (long)pBVar1;
  uVar12 = (uint)uVar13;
  if (uVar12 < ms->nextToUpdate) {
    __assert_fail("target >= idx",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x770b,
                  "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
                 );
  }
  uVar15 = ~(-1 << ((byte)uVar10 & 0x1f));
  pUVar2 = ms->hashTable;
  pBVar3 = ms->tagTable;
  h = ms->rowHashLog + 8;
  cVar4 = (char)ms->rowHashLog;
  bVar8 = 0x38 - cVar4;
  bVar9 = 0x18 - cVar4;
  while( true ) {
    if ((uVar13 & 0xffffffff) <= uVar18) {
      ms->nextToUpdate = uVar12;
      return;
    }
    if (0x20 < h) break;
    p = (long *)(pBVar1 + uVar18);
    uVar6 = ms->hashSalt;
    if (uVar14 == 5) {
      sVar5 = (*p * -0x30e4432345000000 ^ uVar6) >> (bVar8 & 0x3f);
    }
    else if (uVar14 == 6) {
      sVar5 = ZSTD_hash6PtrS(p,h,uVar6);
    }
    else {
      sVar5 = (size_t)(((int)*p * -0x61c8864f ^ (uint)uVar6) >> (bVar9 & 0x1f));
    }
    lVar11 = (sVar5 >> 8 & 0xffffff) << ((byte)uVar10 & 0x3f);
    uVar16 = pBVar3[lVar11] + 0x7f & uVar15;
    uVar6 = 0;
    if (uVar16 == 0) {
      uVar6 = (ulong)uVar15;
    }
    lVar17 = uVar16 + uVar6;
    pBVar3[lVar11] = (BYTE)lVar17;
    uVar6 = ms->hashSalt;
    if (uVar14 == 5) {
      sVar7 = (*p * -0x30e4432345000000 ^ uVar6) >> (bVar8 & 0x3f);
    }
    else if (uVar14 == 6) {
      sVar7 = ZSTD_hash6PtrS(p,h,uVar6);
    }
    else {
      sVar7 = (size_t)(((int)*p * -0x61c8864f ^ (uint)uVar6) >> (bVar9 & 0x1f));
    }
    if (sVar7 != (sVar5 & 0xffffffff)) {
      __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76e9,
                    "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                   );
    }
    pBVar3[lVar17 + lVar11] = (BYTE)sVar5;
    pUVar2[lVar11 + lVar17] = (U32)uVar18;
    uVar18 = uVar18 + 1;
  }
  __assert_fail("hBits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}